

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device_info.cpp
# Opt level: O2

DeviceInfoSigleton * singleton::DeviceInfoSigleton::GetInstance(void)

{
  int iVar1;
  
  if (GetInstance()::singleton == '\0') {
    iVar1 = __cxa_guard_acquire(&GetInstance()::singleton);
    if (iVar1 != 0) {
      DeviceInfoSigleton(&GetInstance::singleton);
      __cxa_atexit(~DeviceInfoSigleton,&GetInstance::singleton,&__dso_handle);
      __cxa_guard_release(&GetInstance()::singleton);
    }
  }
  return &GetInstance::singleton;
}

Assistant:

DeviceInfoSigleton& DeviceInfoSigleton::GetInstance() {
    static DeviceInfoSigleton singleton;
    return singleton;
}